

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void list_append_new(list_t *list,void *data)

{
  list_node_t *node_00;
  list_node_t *node;
  void *data_local;
  list_t *list_local;
  
  node_00 = list_node_new();
  node_00->data = data;
  list_append(list,node_00);
  return;
}

Assistant:

void
list_append_new(
    list_t* list,
    void* data)
{
    list_node_t* node = list_node_new();
    node->data = data;
    list_append(list, node);
}